

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_mct.c
# Opt level: O0

void jpc_ict(jas_matrix_t *c0,jas_matrix_t *c1,jas_matrix_t *c2)

{
  jpc_fix_big_t y_00;
  jpc_fix_big_t y_01;
  jpc_fix_big_t y_02;
  int iVar1;
  int iVar2;
  jas_matind_t jVar3;
  jpc_fix_t jVar4;
  jpc_fix_t jVar5;
  jpc_fix_t jVar6;
  jpc_fix_t jVar7;
  jpc_fix_big_t *local_78;
  jpc_fix_t *c2p;
  jpc_fix_t *c1p;
  jpc_fix_t *c0p;
  jpc_fix_t v;
  jpc_fix_t u;
  jpc_fix_t y;
  jpc_fix_t b;
  jpc_fix_t g;
  jpc_fix_t r;
  int j;
  int i;
  int numcols;
  int numrows;
  jas_matrix_t *c2_local;
  jas_matrix_t *c1_local;
  jas_matrix_t *c0_local;
  
  jVar3 = jas_matrix_numrows(c0);
  iVar1 = (int)jVar3;
  jVar3 = jas_matrix_numrows(c1);
  if (jVar3 == iVar1) {
    jVar3 = jas_matrix_numrows(c2);
    if (jVar3 == iVar1) {
      jVar3 = jas_matrix_numcols(c0);
      iVar2 = (int)jVar3;
      jVar3 = jas_matrix_numcols(c1);
      if (jVar3 == iVar2) {
        jVar3 = jas_matrix_numcols(c2);
        if (jVar3 == iVar2) {
          for (r._4_4_ = 0; r._4_4_ < iVar1; r._4_4_ = r._4_4_ + 1) {
            c1p = jas_matrix_getref(c0,(long)r._4_4_,0);
            c2p = jas_matrix_getref(c1,(long)r._4_4_,0);
            local_78 = jas_matrix_getref(c2,(long)r._4_4_,0);
            for (r._0_4_ = iVar2; 0 < (int)r; r._0_4_ = (int)r + -1) {
              y_00 = *c1p;
              y_01 = *c2p;
              y_02 = *local_78;
              jVar4 = jpc_fix_mul(0x991,y_00);
              jVar5 = jpc_fix_mul(0x12c8,y_01);
              jVar4 = jpc_fix_add(jVar4,jVar5);
              jVar5 = jpc_fix_mul(0x3a5,y_02);
              jVar4 = jpc_fix_add(jVar4,jVar5);
              jVar5 = jpc_fix_mul(-0x566,y_00);
              jVar6 = jpc_fix_mul(-0xa99,y_01);
              jVar5 = jpc_fix_add(jVar5,jVar6);
              jVar6 = jpc_fix_mul(0x1000,y_02);
              jVar5 = jpc_fix_add(jVar5,jVar6);
              jVar6 = jpc_fix_mul(0x1000,y_00);
              jVar7 = jpc_fix_mul(-0xd65,y_01);
              jVar6 = jpc_fix_add(jVar6,jVar7);
              jVar7 = jpc_fix_mul(-0x29a,y_02);
              jVar6 = jpc_fix_add(jVar6,jVar7);
              *c1p = jVar4;
              *c2p = jVar5;
              *local_78 = jVar6;
              local_78 = local_78 + 1;
              c2p = c2p + 1;
              c1p = c1p + 1;
            }
          }
          return;
        }
      }
      __assert_fail("jas_matrix_numcols(c1) == numcols && jas_matrix_numcols(c2) == numcols",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_mct.c"
                    ,0xc1,"void jpc_ict(jas_matrix_t *, jas_matrix_t *, jas_matrix_t *)");
    }
  }
  __assert_fail("jas_matrix_numrows(c1) == numrows && jas_matrix_numrows(c2) == numrows",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_mct.c"
                ,0xbf,"void jpc_ict(jas_matrix_t *, jas_matrix_t *, jas_matrix_t *)");
}

Assistant:

void jpc_ict(jas_matrix_t *c0, jas_matrix_t *c1, jas_matrix_t *c2)
{
	int numrows;
	int numcols;
	int i;
	int j;
	jpc_fix_t r;
	jpc_fix_t g;
	jpc_fix_t b;
	jpc_fix_t y;
	jpc_fix_t u;
	jpc_fix_t v;
	jpc_fix_t *c0p;
	jpc_fix_t *c1p;
	jpc_fix_t *c2p;

	numrows = jas_matrix_numrows(c0);
	assert(jas_matrix_numrows(c1) == numrows && jas_matrix_numrows(c2) == numrows);
	numcols = jas_matrix_numcols(c0);
	assert(jas_matrix_numcols(c1) == numcols && jas_matrix_numcols(c2) == numcols);
	for (i = 0; i < numrows; ++i) {
		c0p = jas_matrix_getref(c0, i, 0);
		c1p = jas_matrix_getref(c1, i, 0);
		c2p = jas_matrix_getref(c2, i, 0);
		for (j = numcols; j > 0; --j) {
			r = *c0p;
			g = *c1p;
			b = *c2p;
			y = jpc_fix_add3(jpc_fix_mul(jpc_dbltofix(0.299), r), jpc_fix_mul(jpc_dbltofix(0.587), g),
			  jpc_fix_mul(jpc_dbltofix(0.114), b));
			u = jpc_fix_add3(jpc_fix_mul(jpc_dbltofix(-0.16875), r), jpc_fix_mul(jpc_dbltofix(-0.33126), g),
			  jpc_fix_mul(jpc_dbltofix(0.5), b));
			v = jpc_fix_add3(jpc_fix_mul(jpc_dbltofix(0.5), r), jpc_fix_mul(jpc_dbltofix(-0.41869), g),
			  jpc_fix_mul(jpc_dbltofix(-0.08131), b));
			*c0p++ = y;
			*c1p++ = u;
			*c2p++ = v;
		}
	}
}